

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::clear
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this)

{
  pointer pSVar1;
  
  pSVar1 = (this->data_).
           super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->data_).
      super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    (this->data_).
    super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  (this->data_).
  super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
    return;
  }
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }